

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_to_bytes(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,uchar *bytes_out,size_t len,
               size_t *written,_Bool is_elements)

{
  wally_tx_input *pwVar1;
  wally_tx_witness_stack *pwVar2;
  wally_tx_witness_item *pwVar3;
  wally_tx_output *pwVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Bool _Var8;
  leint32_t tmp;
  int iVar9;
  uint uVar10;
  undefined4 uVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  uint32_t *puVar16;
  ulong uVar17;
  size_t *written_00;
  byte bVar18;
  uint64_t uVar19;
  uint32_t *bytes_out_00;
  uchar *puVar20;
  uchar *puVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  size_t n;
  size_t witness_count;
  ulong local_48;
  size_t *local_40;
  size_t local_38;
  
  if (opts == (tx_serialize_opts *)0x0) {
    bVar23 = true;
    bVar24 = false;
    bVar18 = 0;
    bVar25 = false;
  }
  else {
    uVar10 = opts->sighash;
    bVar18 = (byte)(uVar10 >> 7) & 1;
    bVar23 = (uVar10 & 0x40) == 0;
    bVar24 = (uVar10 & 0x1f) == 2;
    bVar25 = (uVar10 & 0x1f) == 3;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  written_00 = written;
  _Var8 = is_valid_tx(tx);
  if ((_Var8) && ((bytes_out != (uchar *)0x0 && written != (size_t *)0x0) && flags < 0x10)) {
    sVar12 = (size_t)is_elements;
    iVar9 = tx_get_length(tx,opts,flags,&local_48,is_elements);
    if (iVar9 == 0) {
      if ((opts != (tx_serialize_opts *)0x0 & (byte)flags) != 0) {
        return -1;
      }
      if ((flags & 4) == 0) {
        if (tx->num_inputs == 0) {
          return -2;
        }
        if (tx->num_outputs == 0) {
          return -2;
        }
      }
      else if (tx->num_inputs == 0) {
        if (flags < 8) {
          return -2;
        }
        flags = 0;
      }
      if (len < local_48) {
        *written = local_48;
      }
      else {
        if ((opts != (tx_serialize_opts *)0x0) && (opts->bip143 == true)) {
          iVar9 = tx_to_bip143_bytes(tx,opts,(uint32_t)bytes_out,(uchar *)written,sVar12,written_00)
          ;
          return iVar9;
        }
        if ((flags & 1) != 0) {
          iVar9 = wally_tx_get_witness_count(tx,&local_38);
          if (iVar9 != 0) {
            return -2;
          }
          if (local_38 == 0) {
            flags = 0;
          }
        }
        *(uint32_t *)bytes_out = tx->version;
        puVar20 = bytes_out + 4;
        if (is_elements) {
          if (opts == (tx_serialize_opts *)0x0) {
            bytes_out[4] = (byte)flags & 1;
            puVar20 = bytes_out + 5;
          }
        }
        else if ((flags & 1) != 0) {
          bytes_out[4] = '\0';
          bytes_out[5] = '\x01';
          puVar20 = bytes_out + 6;
        }
        if (bVar18 == 0) {
          sVar12 = varint_to_bytes(tx->num_inputs,puVar20);
          puVar20 = puVar20 + sVar12;
        }
        else {
          *puVar20 = '\x01';
          puVar20 = puVar20 + 1;
        }
        local_40 = written;
        if (tx->num_inputs != 0) {
          lVar22 = 0;
          uVar17 = 0;
          do {
            pwVar1 = tx->inputs;
            puVar21 = pwVar1->txhash + lVar22;
            if (bVar18 == 0) {
              uVar5 = *(undefined8 *)puVar21;
              uVar6 = *(undefined8 *)(puVar21 + 8);
              uVar7 = *(undefined8 *)(puVar21 + 0x18);
              *(undefined8 *)(puVar20 + 0x10) = *(undefined8 *)(puVar21 + 0x10);
              *(undefined8 *)(puVar20 + 0x18) = uVar7;
              *(undefined8 *)puVar20 = uVar5;
              *(undefined8 *)(puVar20 + 8) = uVar6;
              if (opts != (tx_serialize_opts *)0x0) goto LAB_00112023;
              if ((pwVar1->blinding_nonce[lVar22 + -1] & 2) == 0) {
                uVar10 = (pwVar1->blinding_nonce[lVar22 + -1] & 4) << 0x1c |
                         *(uint *)(pwVar1->txhash + lVar22 + 0x20);
              }
              else {
                uVar10 = *(uint *)(pwVar1->txhash + lVar22 + 0x20) | 0x80000000;
              }
              *(uint *)(puVar20 + 0x20) = uVar10;
              sVar12 = varbuff_to_bytes(*(uchar **)(pwVar1->blinding_nonce + lVar22 + -0x19),
                                        *(size_t *)(pwVar1->blinding_nonce + lVar22 + -0x11),
                                        puVar20 + 0x24);
              puVar21 = puVar20 + sVar12 + 0x24;
LAB_001120ad:
              if ((!bVar24 && !bVar25) || (uVar11 = 0, uVar17 == opts->index)) {
                uVar11 = *(undefined4 *)(pwVar1->blinding_nonce + lVar22 + -0x1d);
              }
              *(undefined4 *)puVar21 = uVar11;
              puVar20 = puVar21 + 4;
              if ((pwVar1->blinding_nonce[lVar22 + -1] & 2) == 0 || !is_elements) {
                if ((pwVar1->blinding_nonce[lVar22 + -1] & 2) != 0) {
                  return -2;
                }
              }
              else {
                uVar5 = *(undefined8 *)(pwVar1->blinding_nonce + lVar22);
                uVar6 = *(undefined8 *)(pwVar1->blinding_nonce + lVar22 + 8);
                uVar7 = *(undefined8 *)(pwVar1->blinding_nonce + lVar22 + 0x10 + 8);
                *(undefined8 *)(puVar21 + 0x14) =
                     *(undefined8 *)(pwVar1->blinding_nonce + lVar22 + 0x10);
                *(undefined8 *)(puVar21 + 0x1c) = uVar7;
                *(undefined8 *)puVar20 = uVar5;
                *(undefined8 *)(puVar21 + 0xc) = uVar6;
                uVar5 = *(undefined8 *)(pwVar1->entropy + lVar22);
                uVar6 = *(undefined8 *)(pwVar1->entropy + lVar22 + 8);
                uVar7 = *(undefined8 *)(pwVar1->entropy + lVar22 + 0x10 + 8);
                *(undefined8 *)(puVar21 + 0x34) = *(undefined8 *)(pwVar1->entropy + lVar22 + 0x10);
                *(undefined8 *)(puVar21 + 0x3c) = uVar7;
                *(undefined8 *)(puVar21 + 0x24) = uVar5;
                *(undefined8 *)(puVar21 + 0x2c) = uVar6;
                sVar12 = confidential_value_to_bytes
                                   (*(uchar **)(pwVar1->entropy + lVar22 + 0x27),
                                    *(size_t *)(pwVar1->entropy + lVar22 + 0x2f),puVar21 + 0x44);
                sVar13 = confidential_value_to_bytes
                                   (*(uchar **)(pwVar1->entropy + lVar22 + 0x37),
                                    *(size_t *)(pwVar1->entropy + lVar22 + 0x3f),
                                    puVar21 + sVar12 + 0x44);
                puVar20 = puVar21 + sVar12 + 0x44 + sVar13;
              }
            }
            else if (uVar17 == opts->index) {
              uVar5 = *(undefined8 *)puVar21;
              uVar6 = *(undefined8 *)(puVar21 + 8);
              uVar7 = *(undefined8 *)(puVar21 + 0x18);
              *(undefined8 *)(puVar20 + 0x10) = *(undefined8 *)(puVar21 + 0x10);
              *(undefined8 *)(puVar20 + 0x18) = uVar7;
              *(undefined8 *)puVar20 = uVar5;
              *(undefined8 *)(puVar20 + 8) = uVar6;
LAB_00112023:
              *(undefined4 *)(puVar20 + 0x20) = *(undefined4 *)(pwVar1->txhash + lVar22 + 0x20);
              if (uVar17 == opts->index) {
                sVar12 = varbuff_to_bytes(opts->script,opts->script_len,puVar20 + 0x24);
                puVar21 = puVar20 + 0x24 + sVar12;
              }
              else {
                puVar20[0x24] = '\0';
                puVar21 = puVar20 + 0x25;
              }
              goto LAB_001120ad;
            }
            uVar17 = uVar17 + 1;
            lVar22 = lVar22 + 0xd0;
          } while (uVar17 < tx->num_inputs);
        }
        if (bVar24) {
          *puVar20 = '\0';
          puVar16 = (uint32_t *)(puVar20 + 1);
        }
        else {
          if (bVar25) {
            sVar12 = opts->index + 1;
          }
          else {
            sVar12 = tx->num_outputs;
          }
          sVar13 = varint_to_bytes(sVar12,puVar20);
          puVar16 = (uint32_t *)(puVar20 + sVar13);
          if (sVar12 != 0) {
            lVar22 = 0x68;
            sVar13 = 0;
            do {
              pwVar4 = tx->outputs;
              if ((bVar25) && (sVar13 != opts->index)) {
                *(uchar *)(puVar16 + 2) = '\0';
                puVar16[0] = 0xffffffff;
                puVar16[1] = 0xffffffff;
                puVar16 = (uint32_t *)((long)puVar16 + 9);
              }
              else {
                if ((*(byte *)((long)pwVar4 + lVar22 + -0x50) & 1) == 0) {
                  *(undefined8 *)puVar16 = *(undefined8 *)((long)pwVar4 + lVar22 + -0x68);
                  puVar16 = puVar16 + 2;
                }
                else {
                  if (!is_elements) {
                    return -2;
                  }
                  sVar14 = confidential_value_to_bytes
                                     (*(uchar **)((long)pwVar4 + lVar22 + -0x48),
                                      *(size_t *)((long)pwVar4 + lVar22 + -0x40),(uchar *)puVar16);
                  sVar15 = confidential_value_to_bytes
                                     (*(uchar **)((long)pwVar4 + lVar22 + -0x38),
                                      *(size_t *)((long)pwVar4 + lVar22 + -0x30),
                                      (uchar *)(sVar14 + (long)puVar16));
                  puVar20 = (uchar *)(sVar14 + (long)puVar16) + sVar15;
                  sVar14 = confidential_value_to_bytes
                                     (*(uchar **)((long)pwVar4 + lVar22 + -0x28),
                                      *(size_t *)((long)pwVar4 + lVar22 + -0x20),puVar20);
                  puVar16 = (uint32_t *)(puVar20 + sVar14);
                }
                sVar14 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar22 + -0x60),
                                          *(size_t *)((long)pwVar4 + lVar22 + -0x58),
                                          (uchar *)puVar16);
                puVar16 = (uint32_t *)(sVar14 + (long)puVar16);
                if (is_elements && !bVar23) {
                  sVar14 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar22 + -8),
                                            *(size_t *)((long)&pwVar4->satoshi + lVar22),
                                            (uchar *)puVar16);
                  sVar15 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar22 + -0x18),
                                            *(size_t *)((long)pwVar4 + lVar22 + -0x10),
                                            (uchar *)(sVar14 + (long)puVar16));
                  puVar16 = (uint32_t *)((uchar *)(sVar14 + (long)puVar16) + sVar15);
                }
              }
              sVar13 = sVar13 + 1;
              lVar22 = lVar22 + 0x70;
            } while (sVar12 != sVar13);
          }
        }
        if (((flags & 1) != 0 && !is_elements) && (tx->num_inputs != 0)) {
          uVar17 = 0;
          do {
            pwVar1 = tx->inputs;
            pwVar2 = pwVar1[uVar17].witness;
            if (pwVar2 == (wally_tx_witness_stack *)0x0) {
              sVar12 = varint_to_bytes(0,(uchar *)puVar16);
              puVar16 = (uint32_t *)(sVar12 + (long)puVar16);
            }
            else {
              uVar19 = pwVar2->num_items;
              sVar12 = varint_to_bytes(uVar19,(uchar *)puVar16);
              puVar16 = (uint32_t *)(sVar12 + (long)puVar16);
              if (uVar19 != 0) {
                lVar22 = 8;
                do {
                  pwVar3 = (pwVar1[uVar17].witness)->items;
                  sVar12 = varbuff_to_bytes(*(uchar **)((long)pwVar3 + lVar22 + -8),
                                            *(size_t *)((long)&pwVar3->witness + lVar22),
                                            (uchar *)puVar16);
                  puVar16 = (uint32_t *)((long)puVar16 + sVar12);
                  lVar22 = lVar22 + 0x10;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
              }
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < tx->num_inputs);
        }
        bytes_out_00 = puVar16 + 1;
        *puVar16 = tx->locktime;
        if (opts != (tx_serialize_opts *)0x0) {
          *bytes_out_00 = opts->tx_sighash;
        }
        if (is_elements && (flags & 1) != 0) {
          if (tx->num_inputs != 0) {
            uVar17 = 0;
            do {
              pwVar1 = tx->inputs;
              sVar12 = varbuff_to_bytes(pwVar1[uVar17].issuance_amount_rangeproof,
                                        pwVar1[uVar17].issuance_amount_rangeproof_len,
                                        (uchar *)bytes_out_00);
              sVar13 = varbuff_to_bytes(pwVar1[uVar17].inflation_keys_rangeproof,
                                        pwVar1[uVar17].inflation_keys_rangeproof_len,
                                        (uchar *)(sVar12 + (long)bytes_out_00));
              puVar20 = (uchar *)(sVar12 + (long)bytes_out_00) + sVar13;
              if (pwVar1[uVar17].witness == (wally_tx_witness_stack *)0x0) {
                sVar12 = varint_to_bytes(0,puVar20);
                puVar20 = puVar20 + sVar12;
              }
              else {
                uVar19 = (pwVar1[uVar17].witness)->num_items;
                sVar12 = varint_to_bytes(uVar19,puVar20);
                puVar20 = puVar20 + sVar12;
                if (uVar19 != 0) {
                  lVar22 = 8;
                  do {
                    pwVar3 = (pwVar1[uVar17].witness)->items;
                    sVar12 = varbuff_to_bytes(*(uchar **)((long)pwVar3 + lVar22 + -8),
                                              *(size_t *)((long)&pwVar3->witness + lVar22),puVar20);
                    puVar20 = puVar20 + sVar12;
                    lVar22 = lVar22 + 0x10;
                    uVar19 = uVar19 - 1;
                  } while (uVar19 != 0);
                }
              }
              if (pwVar1[uVar17].pegin_witness == (wally_tx_witness_stack *)0x0) {
                sVar12 = varint_to_bytes(0,puVar20);
                bytes_out_00 = (uint32_t *)(puVar20 + sVar12);
              }
              else {
                uVar19 = (pwVar1[uVar17].pegin_witness)->num_items;
                sVar12 = varint_to_bytes(uVar19,puVar20);
                bytes_out_00 = (uint32_t *)(puVar20 + sVar12);
                if (uVar19 != 0) {
                  lVar22 = 8;
                  do {
                    pwVar3 = (pwVar1[uVar17].pegin_witness)->items;
                    sVar12 = varbuff_to_bytes(*(uchar **)((long)pwVar3 + lVar22 + -8),
                                              *(size_t *)((long)&pwVar3->witness + lVar22),
                                              (uchar *)bytes_out_00);
                    bytes_out_00 = (uint32_t *)((long)bytes_out_00 + sVar12);
                    lVar22 = lVar22 + 0x10;
                    uVar19 = uVar19 - 1;
                  } while (uVar19 != 0);
                }
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < tx->num_inputs);
          }
          if (tx->num_outputs != 0) {
            lVar22 = 0x68;
            uVar17 = 0;
            do {
              pwVar4 = tx->outputs;
              sVar12 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar22 + -0x18),
                                        *(size_t *)((long)pwVar4 + lVar22 + -0x10),
                                        (uchar *)bytes_out_00);
              sVar13 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar22 + -8),
                                        *(size_t *)((long)&pwVar4->satoshi + lVar22),
                                        (uchar *)(sVar12 + (long)bytes_out_00));
              bytes_out_00 = (uint32_t *)((uchar *)(sVar12 + (long)bytes_out_00) + sVar13);
              uVar17 = uVar17 + 1;
              lVar22 = lVar22 + 0x70;
            } while (uVar17 < tx->num_outputs);
          }
        }
        *local_40 = local_48;
      }
      return 0;
    }
  }
  return -2;
}

Assistant:

static int tx_to_bytes(const struct wally_tx *tx,
                       const struct tx_serialize_opts *opts,
                       uint32_t flags,
                       unsigned char *bytes_out, size_t len,
                       size_t *written,
                       bool is_elements)
{
    size_t n, i, j, witness_count;
    const bool anyonecanpay = opts && opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
#ifdef BUILD_ELEMENTS
    const bool sh_rangeproof = opts && opts->sighash & WALLY_SIGHASH_RANGEPROOF;
#endif
    const bool sh_none = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;
    unsigned char *p = bytes_out;

    if (written)
        *written = 0;

    if (!is_valid_tx(tx) ||
        (flags & ~WALLY_TX_ALL_FLAGS) || !bytes_out || !written ||
        tx_get_length(tx, opts, flags, &n, is_elements) != WALLY_OK)
        return WALLY_EINVAL;

    if (opts && (flags & WALLY_TX_FLAG_USE_WITNESS))
        return WALLY_ERROR; /* Segwit tx hashing is handled elsewhere */

    if (!(flags & WALLY_TX_FLAG_ALLOW_PARTIAL)) {
        /* 0-input/output txs can be only be written with this flag */
        if (!tx->num_inputs || !tx->num_outputs)
            return WALLY_EINVAL;
    }

    if (!tx->num_inputs) {
        /* 0-input txs can only be written in the pre-BIP144 format,
         * since otherwise the resulting tx is ambiguous.
         * Used in PSBTs while building the tx for example.
         */
        if (!(flags & WALLY_TX_FLAG_PRE_BIP144))
            return WALLY_EINVAL;
        flags &= ~WALLY_TX_FLAG_USE_WITNESS;
    }

    if (n > len) {
        *written = n;
        return WALLY_OK;
    }

    if (opts && opts->bip143)
        return tx_to_bip143_bytes(tx, opts, flags, bytes_out, len, written);

    if (flags & WALLY_TX_FLAG_USE_WITNESS) {
        if (wally_tx_get_witness_count(tx, &witness_count) != WALLY_OK)
            return WALLY_EINVAL;
        if (!witness_count)
            flags &= ~WALLY_TX_FLAG_USE_WITNESS;
    }

    p += uint32_to_le_bytes(tx->version, p);
    if (is_elements) {
        if (!opts)
            *p++ = flags & WALLY_TX_FLAG_USE_WITNESS ? 1 : 0;
    } else {
        if (flags & WALLY_TX_FLAG_USE_WITNESS) {
            *p++ = 0; /* Write BIP 144 marker */
            *p++ = 1; /* Write BIP 144 flag */
        }
    }
    if (anyonecanpay)
        *p++ = 1;
    else
        p += varint_to_bytes(tx->num_inputs, p);

    for (i = 0; i < tx->num_inputs; ++i) {
        const struct wally_tx_input *input = tx->inputs + i;
        if (anyonecanpay && i != opts->index)
            continue; /* anyonecanpay only signs the given index */

        memcpy(p, input->txhash, sizeof(input->txhash));
        p += sizeof(input->txhash);
        if (!opts && (input->features & WALLY_TX_IS_ISSUANCE))
            p += uint32_to_le_bytes(input->index | WALLY_TX_ISSUANCE_FLAG, p);
        else if (!opts && (input->features & WALLY_TX_IS_PEGIN))
            p += uint32_to_le_bytes(input->index | WALLY_TX_PEGIN_FLAG, p);
        else
            p += uint32_to_le_bytes(input->index, p);
        if (opts) {
            if (i == opts->index)
                p += varbuff_to_bytes(opts->script, opts->script_len, p);
            else
                *p++ = 0; /* Blank scripts for non-signing inputs */
        } else
            p += varbuff_to_bytes(input->script, input->script_len, p);

        if ((sh_none || sh_single) && i != opts->index)
            p += uint32_to_le_bytes(0, p);
        else
            p += uint32_to_le_bytes(input->sequence, p);
        if (input->features & WALLY_TX_IS_ISSUANCE) {
            if (!is_elements)
                return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
            memcpy(p, input->blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
            p += WALLY_TX_ASSET_TAG_LEN;
            memcpy(p, input->entropy, WALLY_TX_ASSET_TAG_LEN);
            p += WALLY_TX_ASSET_TAG_LEN;
            p += confidential_value_to_bytes(input->issuance_amount, input->issuance_amount_len, p);
            p += confidential_value_to_bytes(input->inflation_keys, input->inflation_keys_len, p);
#endif
        }
    }

    if (sh_none)
        *p++ = 0;
    else {
        size_t num_outputs = sh_single ? opts->index + 1 : tx->num_outputs;
        p += varint_to_bytes(num_outputs, p);

        for (i = 0; i < num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            if (sh_single && i != opts->index) {
                memcpy(p, EMPTY_OUTPUT, sizeof(EMPTY_OUTPUT));
                p += sizeof(EMPTY_OUTPUT);
            } else {
                if (output->features & WALLY_TX_IS_ELEMENTS) {
                    if (!is_elements)
                        return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
                    p += confidential_value_to_bytes(output->asset, output->asset_len, p);
                    p += confidential_value_to_bytes(output->value, output->value_len, p);
                    p += confidential_value_to_bytes(output->nonce, output->nonce_len, p);
#endif
                } else {
                    p += uint64_to_le_bytes(output->satoshi, p);
                }
                p += varbuff_to_bytes(output->script, output->script_len, p);

#ifdef BUILD_ELEMENTS
                if (is_elements && sh_rangeproof) {
                    p += varbuff_to_bytes(output->rangeproof,
                                          output->rangeproof_len, p);
                    p += varbuff_to_bytes(output->surjectionproof,
                                          output->surjectionproof_len, p);
                }
#endif
            }
        }
    }

    if (!is_elements && (flags & WALLY_TX_FLAG_USE_WITNESS)) {
        for (i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items = input->witness ? input->witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
        }
    }

    p += uint32_to_le_bytes(tx->locktime, p);
    if (opts)
        uint32_to_le_bytes(opts->tx_sighash, p);

#ifdef BUILD_ELEMENTS
    if (is_elements && (flags & WALLY_TX_FLAG_USE_WITNESS)) {
        for (i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items;
            p += varbuff_to_bytes(input->issuance_amount_rangeproof, input->issuance_amount_rangeproof_len, p);
            p += varbuff_to_bytes(input->inflation_keys_rangeproof, input->inflation_keys_rangeproof_len, p);
            num_items = input->witness ? input->witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
            num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->pegin_witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
        }
        for (i = 0; i < tx->num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            p += varbuff_to_bytes(output->surjectionproof, output->surjectionproof_len, p);
            p += varbuff_to_bytes(output->rangeproof, output->rangeproof_len, p);
        }
    }
#endif
    *written = n;
    return WALLY_OK;
}